

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O1

char * deStrcat(char *s1,size_t size,char *s2)

{
  char *pcVar1;
  
  pcVar1 = strncat(s1,s2,size);
  return pcVar1;
}

Assistant:

char* deStrcat (char* s1, size_t size, const char* s2)
{
#if (DE_COMPILER == DE_COMPILER_MSC) && (DE_OS != DE_OS_WINCE)
	(void)strcat_s(s1, size, s2);
	return s1;
#else
	return strncat(s1, s2, size);
#endif
}